

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawString
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  uint uVar1;
  Mode MVar2;
  uint uVar3;
  uint uVar4;
  Pixel PVar5;
  short sVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  uint32_t j;
  uint uVar14;
  int iVar15;
  uint32_t is;
  uint32_t uVar16;
  bool bVar17;
  
  MVar2 = this->nPixelMode;
  if (MVar2 != CUSTOM) {
    this->nPixelMode = ((uint)col.field_0 < 0xff000000) + MASK;
  }
  pcVar10 = (sText->_M_dataplus)._M_p;
  pcVar7 = pcVar10 + sText->_M_string_length;
  iVar12 = 0;
  iVar13 = 0;
  for (; pcVar10 != pcVar7; pcVar10 = pcVar10 + 1) {
    if (*pcVar10 == 10) {
      iVar12 = iVar12 + scale * 8;
      iVar13 = 0;
    }
    else {
      sVar6 = *pcVar10 + -0x20;
      uVar3 = (int)(sVar6 % 0x10) << 3;
      uVar8 = (sVar6 / 0x10) * 8;
      if (scale < 2) {
        for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
          for (iVar15 = 0; iVar15 != 8; iVar15 = iVar15 + 1) {
            PVar5 = Sprite::GetPixel(this->fontSprite,uVar4 | uVar3,uVar8 + iVar15);
            if (PVar5.field_0._0_1_ != '\0') {
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(x + iVar13 + uVar4),(ulong)(uint)(y + iVar12 + iVar15),
                         col.field_0);
            }
          }
        }
      }
      else {
        for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
          uVar1 = y + iVar12;
          for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
            PVar5 = Sprite::GetPixel(this->fontSprite,uVar4 | uVar3,uVar9 | uVar8);
            if (PVar5.field_0._0_1_ != '\0') {
              for (uVar16 = 0; uVar16 != scale; uVar16 = uVar16 + 1) {
                uVar14 = uVar1;
                uVar11 = scale;
                while( true ) {
                  bVar17 = uVar11 == 0;
                  uVar11 = uVar11 - 1;
                  if (bVar17) break;
                  (*this->_vptr_PixelGameEngine[5])
                            (this,(ulong)(uVar4 * scale + x + iVar13 + uVar16),(ulong)uVar14,
                             col.field_0);
                  uVar14 = uVar14 + 1;
                }
              }
            }
            uVar1 = uVar1 + scale;
          }
        }
      }
      iVar13 = iVar13 + scale * 8;
    }
  }
  this->nPixelMode = MVar2;
  return;
}

Assistant:

void PixelGameEngine::DrawString(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;
		// Thanks @tucna, spotted bug with col.ALPHA :P
		if (m != Pixel::CUSTOM) // Thanks @Megarev, required for "shaders"
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								for (uint32_t is = 0; is < scale; is++)
									for (uint32_t js = 0; js < scale; js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += 8 * scale;
			}
		}
		SetPixelMode(m);
	}